

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O0

int UnguessVarType(VARTYPE vartype)

{
  int local_c;
  VARTYPE vartype_local;
  
  switch(vartype) {
  case VARTYPE_RFA:
    local_c = 0x191;
    break;
  default:
    local_c = 0x157;
    break;
  case VARTYPE_FIXSTR:
  case VARTYPE_DYNSTR:
    local_c = 0x1a0;
    break;
  case VARTYPE_BYTE:
    local_c = 0x110;
    break;
  case VARTYPE_WORD:
    local_c = 0x1ba;
    break;
  case VARTYPE_INTEGER:
    local_c = 0x157;
    break;
  case VARTYPE_LONG:
    local_c = 0x15f;
    break;
  case VARTYPE_SINGLE:
    local_c = 0x199;
    break;
  case VARTYPE_REAL:
    local_c = 0x182;
    break;
  case VARTYPE_DOUBLE:
    local_c = 300;
    break;
  case VARTYPE_HFLOAT:
    local_c = 0x14f;
    break;
  case VARTYPE_GFLOAT:
    local_c = 0x149;
    break;
  case VARTYPE_DECIMAL:
    local_c = 0x123;
  }
  return local_c;
}

Assistant:

int UnguessVarType(
	VARTYPE vartype		/**< Type of variable to 
				 * work backwards from. */
)
{
	switch(vartype)
	{
	case VARTYPE_RFA:
		return BAS_S_RFA;
	case VARTYPE_FIXSTR:
	case VARTYPE_DYNSTR:
		return BAS_S_STRING;
	case VARTYPE_BYTE:
		return BAS_S_BYTE;
	case VARTYPE_WORD:
		return BAS_S_WORD;
	case VARTYPE_INTEGER:
		return BAS_S_INTEGER;
	case VARTYPE_LONG:
		return BAS_S_LONG;
	case VARTYPE_SINGLE:
		return BAS_S_SINGLE;
	case VARTYPE_REAL:
		return BAS_S_REAL;
	case VARTYPE_DOUBLE:
		return BAS_S_DOUBLE;
	case VARTYPE_HFLOAT:
		return BAS_S_HFLOAT;
	case VARTYPE_GFLOAT:
		return BAS_S_GFLOAT;
	case VARTYPE_DECIMAL:
		return BAS_S_DECIMAL;
	default:
		return BAS_S_INTEGER;
	}
}